

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O0

plock_entry_t * plock_lock(plock *plock,void *start,void *len)

{
  int iVar1;
  list_elem *plVar2;
  void *pvVar3;
  void *in_RDX;
  void *in_RSI;
  list *in_RDI;
  plock_node *node;
  list_elem *le;
  plock_entry_t *local_30;
  list_elem *local_28;
  
  if (((in_RDI == (list *)0x0) || (in_RSI == (void *)0x0)) || (in_RDX == (void *)0x0)) {
    return (plock_entry_t *)0x0;
  }
  (*(code *)in_RDI[2].head[2].next)(in_RDI[4].head);
  local_28 = list_begin(in_RDI);
  while (local_28 != (list_elem *)0x0) {
    iVar1 = (*(code *)in_RDI[2].head[4].prev)
                      (local_28[-2].next,local_28[-1].prev,in_RSI,in_RDX,in_RDI[4].tail);
    if (iVar1 == 0) {
      local_28 = list_next(local_28);
    }
    else {
      *(int *)&local_28[-1].next = *(int *)&local_28[-1].next + 1;
      (*(code *)in_RDI[2].head[3].prev)(in_RDI[4].head);
      (*(code *)(in_RDI[2].head)->next)(local_28[-2].prev);
      (*(code *)in_RDI[2].head[2].next)(in_RDI[4].head);
      plVar2 = list_next(local_28);
      *(int *)&local_28[-1].next = *(int *)&local_28[-1].next + -1;
      if (*(int *)&local_28[-1].next == 0) {
        list_remove(in_RDI,local_28);
        list_push_front(in_RDI + 1,local_28);
      }
      (*(code *)in_RDI[2].head[1].prev)(local_28[-2].prev);
      local_28 = plVar2;
    }
  }
  plVar2 = list_pop_front(in_RDI + 1);
  if (plVar2 == (list_elem *)0x0) {
    local_30 = (plock_entry_t *)malloc(0x30);
    if (local_30 == (plock_entry_t *)0x0) {
      (*(code *)in_RDI[2].head[3].prev)(in_RDI[4].head);
      return (plock_entry_t *)0x0;
    }
    plVar2 = (list_elem *)malloc((size_t)in_RDI[2].tail);
    local_30->lock = plVar2;
    (*(code *)(in_RDI[2].head)->prev)((list_elem *)local_30->lock);
    plVar2 = (list_elem *)malloc((size_t)in_RDI[3].tail);
    local_30->start = plVar2;
    pvVar3 = malloc((size_t)in_RDI[3].tail);
    local_30->len = pvVar3;
    if ((((list_elem *)local_30->lock == (list_elem *)0x0) ||
        ((list_elem *)local_30->start == (list_elem *)0x0)) || (local_30->len == (void *)0x0)) {
      free(local_30);
      (*(code *)in_RDI[2].head[3].prev)(in_RDI[4].head);
      return (plock_entry_t *)0x0;
    }
  }
  else {
    local_30 = (plock_entry_t *)(plVar2 + -2);
  }
  local_30->wcount = 0;
  memcpy((list_elem *)local_30->start,in_RSI,(size_t)in_RDI[3].tail);
  memcpy(local_30->len,in_RDX,(size_t)in_RDI[3].tail);
  list_push_back(in_RDI,&local_30->le);
  (*(code *)(in_RDI[2].head)->next)((list_elem *)local_30->lock);
  (*(code *)in_RDI[2].head[3].prev)(in_RDI[4].head);
  return local_30;
}

Assistant:

plock_entry_t *plock_lock(struct plock *plock, void *start, void *len)
{
    struct list_elem *le = NULL;
    struct plock_node *node = NULL;

    if (!plock || !start || !len) {
        return NULL;
    }

    // grab plock's lock
    plock->ops->lock_internal(plock->lock);

    // find existing overlapped lock
    le = list_begin(&plock->active);
    while (le) {
        node = _get_entry(le, struct plock_node, le);
        if (plock->ops->is_overlapped(node->start, node->len,
                                      start, len, plock->aux)) {
            // overlapped
            // increase waiting count
            node->wcount++;
            // release plock's lock
            plock->ops->unlock_internal(plock->lock);

            // grab node's lock
            plock->ops->lock_user(node->lock);
            // got control .. that means the owner released the lock
            // grab plock's lock
            plock->ops->lock_internal(plock->lock);
            // decrease waiting count
            le = list_next(&node->le);
            node->wcount--;
            if (node->wcount == 0) {
                // no other thread refers this node
                // move from active to inactive
                list_remove(&plock->active, &node->le);
                list_push_front(&plock->inactive, &node->le);
            }
            // release node's lock
            plock->ops->unlock_user(node->lock);
        } else {
            le = list_next(le);
        }
    }

    // get a free lock
    le = list_pop_front(&plock->inactive);
    if (le == NULL) {
        // no free lock .. create one
        node = (struct plock_node *)malloc(sizeof(struct plock_node));
        if (!node) {
            plock->ops->unlock_internal(plock->lock);
            return NULL;
        }
        node->lock = (void *)malloc(plock->sizeof_lock_user);
        plock->ops->init_user(node->lock);
        node->start = (void *)malloc(plock->sizeof_range);
        node->len = (void *)malloc(plock->sizeof_range);
        if (!node->lock || !node->start || !node->len) {
            free(node);
            plock->ops->unlock_internal(plock->lock);
            return NULL;
        }
    } else {
        node = _get_entry(le, struct plock_node ,le);
    }
    node->wcount = 0;

    // copy start & len value
    memcpy(node->start, start, plock->sizeof_range);
    memcpy(node->len, len, plock->sizeof_range);
    // insert into active list
    list_push_back(&plock->active, &node->le);

    // grab node's lock & release plock's lock
    plock->ops->lock_user(node->lock);
    plock->ops->unlock_internal(plock->lock);

    return node;
}